

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogreadertest.hpp
# Opt level: O0

void __thiscall
CatalogReaderTest_testConstructorCourseHeirarchyCHE_Test::TestBody
          (CatalogReaderTest_testConstructorCourseHeirarchyCHE_Test *this)

{
  bool bVar1;
  AbstractMajor *major_00;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  AssertHelper local_150;
  Message local_148 [6];
  exception *e;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  local_110;
  undefined1 auStack_d8 [8];
  TrueWithString gtest_msg;
  CatalogReader reader;
  AbstractMajor *major;
  CatalogReaderTest_testConstructorCourseHeirarchyCHE_Test *this_local;
  
  major_00 = (AbstractMajor *)operator_new(0x40);
  ChemicalEngineering::ChemicalEngineering((ChemicalEngineering *)major_00);
  CatalogReader::CatalogReader((CatalogReader *)((long)&gtest_msg.value.field_2 + 8),major_00);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_d8 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_d8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_d8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CatalogReader::createCourseHeirarchy_abi_cxx11_
                (&local_110,(CatalogReader *)((long)&gtest_msg.value.field_2 + 8));
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
      ::~unordered_map(&local_110);
    }
    e._4_4_ = 0;
  }
  else {
    testing::Message::Message(local_148);
    std::operator+(&local_170,
                   "Expected: reader.createCourseHeirarchy() doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8)
    ;
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Varhagna[P]Course-Planner/test/../test/catalogreadertest.hpp"
               ,0x37,message);
    testing::internal::AssertHelper::operator=(&local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    testing::Message::~Message(local_148);
    e._4_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_d8);
  if (e._4_4_ == 0) {
    e._4_4_ = 0;
  }
  CatalogReader::~CatalogReader((CatalogReader *)((long)&gtest_msg.value.field_2 + 8));
  return;
}

Assistant:

TEST(CatalogReaderTest, testConstructorCourseHeirarchyCHE) {
    AbstractMajor* major = new ChemicalEngineering();

    CatalogReader reader(major);

    ASSERT_NO_THROW(reader.createCourseHeirarchy());
}